

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_EndUnion(void)

{
  UnionStackEntry *pUVar1;
  UnionStackEntry *next;
  
  if (unionStack == (UnionStackEntry *)0x0) {
    error("Found ENDU outside of a UNION construct\n");
  }
  else {
    endUnionMember();
    curOffset = unionStack->size + curOffset;
    pUVar1 = unionStack->next;
    free(unionStack);
    unionStack = pUVar1;
  }
  return;
}

Assistant:

void sect_EndUnion(void)
{
	if (!unionStack) {
		error("Found ENDU outside of a UNION construct\n");
		return;
	}
	endUnionMember();
	curOffset += unionStack->size;
	struct UnionStackEntry *next = unionStack->next;

	free(unionStack);
	unionStack = next;
}